

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomdpx.cpp
# Opt level: O3

void __thiscall despot::POMDPX::CreateScenarioUpperBound(POMDPX *this)

{
  string *in_RDX;
  string *in_RSI;
  
  CreateScenarioUpperBound((POMDPX *)&this[-1].memory_pool_.freelist_,in_RSI,in_RDX);
  return;
}

Assistant:

ScenarioUpperBound* POMDPX::CreateScenarioUpperBound(string name,
	string particle_bound_name) const {
	if (!is_small_) {
		return new TrivialParticleUpperBound(this);
	}

	const StateIndexer* indexer = this;

	if (name == "TRIVIAL") {
		return new TrivialParticleUpperBound(this);
	} else if (name == "MDP" || name == "DEFAULT") {
		return new MDPUpperBound(this, *this);
	} else if (name == "LOOKAHEAD") {
		return new LookaheadUpperBound(this, *indexer,
			CreateParticleUpperBound(particle_bound_name));
	} else {
		cerr << "Unsupported scenario upper bound: " << name << endl;
		exit(1);
		return NULL;
	}
}